

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O3

void __thiscall
raft_functional_common::TestSm::save_logical_snp_obj
          (TestSm *this,snapshot *s,ulong *obj_id,buffer *data,bool is_first_obj,bool is_last_obj)

{
  int32_t iVar1;
  size_t sVar2;
  mapped_type *pmVar3;
  ulong log_idx;
  ptr<buffer> data_commit;
  ptr<buffer> data_precommit;
  buffer_serializer bs;
  uint64_t local_68;
  element_type *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  string local_40;
  
  if ((this->snpDelayMs).super___atomic_base<unsigned_long>._M_i != 0) {
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    TestSuite::sleep_ms((this->snpDelayMs).super___atomic_base<unsigned_long>._M_i,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  if (*obj_id == 0) {
    *obj_id = 1;
  }
  else {
    sVar2 = nuraft::buffer::size(data);
    if (sVar2 == 8) {
      *obj_id = *obj_id + 1;
    }
    else {
      nuraft::buffer_serializer::buffer_serializer((buffer_serializer *)&local_40,data,LITTLE);
      local_68 = nuraft::buffer_serializer::get_u64((buffer_serializer *)&local_40);
      iVar1 = nuraft::buffer_serializer::get_i32((buffer_serializer *)&local_40);
      nuraft::buffer::alloc((buffer *)&local_60,(long)iVar1);
      nuraft::buffer_serializer::get_buffer((buffer_serializer *)&local_40,(ptr<buffer> *)&local_60)
      ;
      pmVar3 = std::
               map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
               ::operator[](&this->commits,&local_68);
      (pmVar3->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_60;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar3->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount,&local_58);
      nuraft::buffer::copy((EVP_PKEY_CTX *)&local_50,(EVP_PKEY_CTX *)local_60);
      pmVar3 = std::
               map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
               ::operator[](&this->preCommits,&local_68);
      (pmVar3->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_50;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar3->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount,&local_48);
      *obj_id = *obj_id + 1;
      if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
      }
      if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
      }
    }
  }
  return;
}

Assistant:

void save_logical_snp_obj(snapshot& s,
                              ulong& obj_id,
                              buffer& data,
                              bool is_first_obj,
                              bool is_last_obj)
    {
        if (snpDelayMs) {
            TestSuite::sleep_ms(snpDelayMs);
        }

        if (obj_id == 0) {
            // Special object containing metadata.
            // Request next object.
            obj_id++;
            return;
        }

        if (data.size() == sizeof(ulong)) {
            // Special object representing config change.
            // Nothing to do for state machine.
            // Request next object.
            obj_id++;
            return;
        }

        buffer_serializer bs(data);
        ulong log_idx = bs.get_u64();

        // In this test state machine implementation,
        // obj id should be always the same as log index.
        assert(log_idx == obj_id);

        int32 data_size = bs.get_i32();
        ptr<buffer> data_commit = buffer::alloc(data_size);
        bs.get_buffer( data_commit );

        commits[log_idx] = data_commit;

        ptr<buffer> data_precommit = buffer::copy(*data_commit);
        preCommits[log_idx] = data_precommit;

        // Request next object.
        obj_id++;
    }